

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SkippedTest.cpp
# Opt level: O3

unique_ptr<const_oout::Result,_std::default_delete<const_oout::Result>_> __thiscall
oout::SkippedTest::result(SkippedTest *this)

{
  SuccessResult *this_00;
  TestResult *this_01;
  _Head_base<0UL,_oout::SuccessResult_*,_false> local_40;
  string local_38;
  
  this_00 = (SuccessResult *)operator_new(0x28);
  local_38._M_string_length = 0;
  local_38.field_2._M_local_buf[0] = '\0';
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  SuccessResult::SuccessResult(this_00,&local_38);
  local_40._M_head_impl = this_00;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,
                    CONCAT71(local_38.field_2._M_allocated_capacity._1_7_,
                             local_38.field_2._M_local_buf[0]) + 1);
  }
  this_01 = (TestResult *)operator_new(0x18);
  std::__shared_ptr<oout::Result_const,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<oout::SuccessResult,std::default_delete<oout::SuccessResult>,void>
            ((__shared_ptr<oout::Result_const,(__gnu_cxx::_Lock_policy)2> *)&local_38,
             (unique_ptr<oout::SuccessResult,_std::default_delete<oout::SuccessResult>_> *)&local_40
            );
  TestResult::TestResult(this_01,(shared_ptr<const_oout::Result> *)&local_38);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38._M_string_length);
  }
  (this->super_Test)._vptr_Test = (_func_int **)this_01;
  if (local_40._M_head_impl != (SuccessResult *)0x0) {
    std::default_delete<oout::SuccessResult>::operator()
              ((default_delete<oout::SuccessResult> *)&local_40,local_40._M_head_impl);
  }
  return (__uniq_ptr_data<const_oout::Result,_std::default_delete<const_oout::Result>,_true,_true>)
         (__uniq_ptr_data<const_oout::Result,_std::default_delete<const_oout::Result>,_true,_true>)
         this;
}

Assistant:

unique_ptr<const Result> SkippedTest::result() const
{
	return make_unique<TestResult>(make_unique<SuccessResult>());
}